

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrepFaceField.h
# Opt level: O2

void anurbs::BrepFaceField<1l>::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  class_<anurbs::BrepFaceField<1l>,std::shared_ptr<anurbs::BrepFaceField<1l>>> *pcVar1;
  string name;
  class_<anurbs::BrepFaceField<1L>,_std::shared_ptr<anurbs::BrepFaceField<1L>_>_> cStack_b8;
  char *local_b0 [4];
  arg local_90;
  code *local_80;
  undefined8 local_78;
  arg local_70;
  arg local_60;
  code *local_50;
  undefined8 local_48;
  code *local_40;
  undefined8 local_38;
  code *local_30;
  undefined8 local_28;
  arg local_20;
  
  python_name_abi_cxx11_();
  pybind11::class_<anurbs::BrepFaceField<1L>,_std::shared_ptr<anurbs::BrepFaceField<1L>_>_>::
  class_<>(&cStack_b8,(m->super_object).super_handle.m_ptr,local_b0[0]);
  local_20.name = "face";
  local_20._8_1_ = 2;
  pybind11::detail::initimpl::constructor<anurbs::Ref<anurbs::BrepFace>_>::
  execute<pybind11::class_<anurbs::BrepFaceField<1L>,_std::shared_ptr<anurbs::BrepFaceField<1L>_>_>,_pybind11::arg,_0>
            (&cStack_b8,&local_20);
  local_30 = BrepFaceField<1L>::face;
  local_28 = 0;
  pcVar1 = (class_<anurbs::BrepFaceField<1l>,std::shared_ptr<anurbs::BrepFaceField<1l>>> *)
           pybind11::class_<anurbs::BrepFaceField<1l>,std::shared_ptr<anurbs::BrepFaceField<1l>>>::
           def_property_readonly<anurbs::Ref<anurbs::BrepFace>(anurbs::BrepFaceField<1l>::*)()const>
                     ((class_<anurbs::BrepFaceField<1l>,std::shared_ptr<anurbs::BrepFaceField<1l>>>
                       *)&cStack_b8,"face",(offset_in_Model_to_subr *)&local_30);
  local_40 = BrepFaceField<1L>::values;
  local_38 = 0;
  pcVar1 = (class_<anurbs::BrepFaceField<1l>,std::shared_ptr<anurbs::BrepFaceField<1l>>> *)
           pybind11::class_<anurbs::BrepFaceField<1l>,std::shared_ptr<anurbs::BrepFaceField<1l>>>::
           def_property_readonly<std::vector<Eigen::Matrix<double,1,1,1,1,1>,std::allocator<Eigen::Matrix<double,1,1,1,1,1>>>const&(anurbs::BrepFaceField<1l>::*)()const>
                     (pcVar1,"values",(offset_in_Model_to_subr *)&local_40);
  local_50 = BrepFaceField<1L>::set_value;
  local_48 = 0;
  local_60.name = "index";
  local_60._8_1_ = 2;
  local_70.name = "value";
  local_70._8_1_ = 2;
  pcVar1 = (class_<anurbs::BrepFaceField<1l>,std::shared_ptr<anurbs::BrepFaceField<1l>>> *)
           pybind11::class_<anurbs::BrepFaceField<1l>,std::shared_ptr<anurbs::BrepFaceField<1l>>>::
           def<void(anurbs::BrepFaceField<1l>::*)(long,Eigen::Matrix<double,1,1,1,1,1>const&),pybind11::arg,pybind11::arg>
                     (pcVar1,"set_value",(offset_in_Model_to_subr *)&local_50,&local_60,&local_70);
  local_80 = BrepFaceField<1L>::value;
  local_78 = 0;
  local_90.name = "index";
  local_90._8_1_ = 2;
  pybind11::class_<anurbs::BrepFaceField<1l>,std::shared_ptr<anurbs::BrepFaceField<1l>>>::
  def<Eigen::Matrix<double,1,1,1,1,1>(anurbs::BrepFaceField<1l>::*)(long)const,pybind11::arg>
            (pcVar1,"value",(offset_in_Model_to_subr *)&local_80,&local_90);
  pybind11::object::~object((object *)&cStack_b8);
  std::__cxx11::string::~string((string *)local_b0);
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = BrepFaceField<TDimension>;
        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Holder>(m, name.c_str())
            // constructors
            .def(py::init<Ref<BrepFace>>(), "face"_a)
            // read-only properties
            .def_property_readonly("face", &Type::face)
            .def_property_readonly("values", &Type::values)
            // methods
            .def("set_value", &Type::set_value, "index"_a, "value"_a)
            .def("value", &Type::value, "index"_a)
        ;
    }